

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

Field * __thiscall
google::protobuf::util::converter::ProtoWriter::BeginNamed
          (ProtoWriter *this,StringPiece name,bool is_list)

{
  ProtoElement *pPVar1;
  Field *pFVar2;
  LocationTrackerInterface *pLVar3;
  
  if (this->invalid_depth_ < 1) {
    pFVar2 = Lookup(this,name);
    if (pFVar2 == (Field *)0x0) {
      this->invalid_depth_ = this->invalid_depth_ + 1;
    }
    else {
      if (!is_list) {
        return pFVar2;
      }
      if (pFVar2->cardinality_ == 3) {
        return pFVar2;
      }
      this->invalid_depth_ = this->invalid_depth_ + 1;
      pPVar1 = (this->element_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
               ._M_head_impl;
      if (pPVar1 == (ProtoElement *)0x0) {
        pLVar3 = (this->tracker_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                 ._M_head_impl;
      }
      else {
        pLVar3 = &pPVar1->super_LocationTrackerInterface;
      }
      (*this->listener_->_vptr_ErrorListener[2])
                (this->listener_,pLVar3,name.ptr_,name.length_,
                 "Proto field is not repeating, cannot start list.",0x30);
    }
  }
  else {
    this->invalid_depth_ = this->invalid_depth_ + 1;
  }
  return (Field *)0x0;
}

Assistant:

const google::protobuf::Field* ProtoWriter::BeginNamed(StringPiece name,
                                                       bool is_list) {
  if (invalid_depth_ > 0) {
    ++invalid_depth_;
    return nullptr;
  }
  const google::protobuf::Field* field = Lookup(name);
  if (field == nullptr) {
    ++invalid_depth_;
    // InvalidName() already called in Lookup().
    return nullptr;
  }
  if (is_list && !IsRepeated(*field)) {
    ++invalid_depth_;
    InvalidName(name, "Proto field is not repeating, cannot start list.");
    return nullptr;
  }
  return field;
}